

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::shl(bigint *this,size_t n)

{
  bool bVar1;
  size_t div;
  size_t rem;
  size_t n_local;
  bigint *this_local;
  
  if (((n & 0x3f) == 0) || (bVar1 = shl_bits(this,n & 0x3f), bVar1)) {
    if ((n >> 6 == 0) || (bVar1 = shl_limbs(this,n >> 6), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl(size_t n) noexcept {
    size_t rem = n % limb_bits;
    size_t div = n / limb_bits;
    if (rem != 0) {
      FASTFLOAT_TRY(shl_bits(rem));
    }
    if (div != 0) {
      FASTFLOAT_TRY(shl_limbs(div));
    }
    return true;
  }